

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExportNode.h
# Opt level: O2

void Assimp::FBX::Node::WritePropertyNode<int>
               (string *name,int value,StreamWriterLE *s,bool binary,int indent)

{
  FBXExportProperty p;
  Node node;
  FBXExportProperty FStack_d8;
  FBXExportProperty local_b8;
  Node local_98;
  
  FBX::FBXExportProperty::FBXExportProperty(&local_b8,value);
  FBX::FBXExportProperty::FBXExportProperty(&FStack_d8,&local_b8);
  Node<Assimp::FBX::FBXExportProperty>(&local_98,name,&FStack_d8);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&FStack_d8.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  Dump(&local_98,s,binary,indent);
  ~Node(&local_98);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&local_b8.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return;
}

Assistant:

static void WritePropertyNode(
        const std::string& name,
        const T value,
        Assimp::StreamWriterLE& s,
        bool binary, int indent
    ) {
        FBX::FBXExportProperty p(value);
        FBX::Node node(name, p);
        node.Dump(s, binary, indent);
    }